

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

void __thiscall OpenMD::HydroProp::HydroProp(HydroProp *this,Vector3d *cor,Mat6x6d *Xi)

{
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  Vector<double,_3U>::Vector(&(this->cor_).super_Vector<double,_3U>,&cor->super_Vector<double,_3U>);
  RectMatrix<double,_6U,_6U>::operator=
            (&(this->Xi_).super_RectMatrix<double,_6U,_6U>,&Xi->super_RectMatrix<double,_6U,_6U>);
  SquareMatrix<double,_6>::SquareMatrix(&this->S_);
  this->hasCOR_ = true;
  this->hasXi_ = true;
  this->hasS_ = false;
  return;
}

Assistant:

HydroProp::HydroProp(Vector3d cor, Mat6x6d Xi) :
      cor_(cor), Xi_(Xi), hasCOR_(true), hasXi_(true), hasS_(false) {}